

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHandlerCommand.cxx
# Opt level: O0

bool __thiscall cmCTestHandlerCommand::CheckArgumentKeyword(cmCTestHandlerCommand *this,string *arg)

{
  bool bVar1;
  size_type sVar2;
  reference ppcVar3;
  uint local_24;
  uint k;
  string *arg_local;
  cmCTestHandlerCommand *this_local;
  
  bVar1 = std::operator==(arg,"APPEND");
  if (bVar1) {
    this->ArgumentDoing = 0;
    this->AppendXML = true;
    this_local._7_1_ = true;
  }
  else {
    bVar1 = std::operator==(arg,"QUIET");
    if (bVar1) {
      this->ArgumentDoing = 0;
      this->Quiet = true;
      this_local._7_1_ = true;
    }
    else {
      for (local_24 = 0;
          sVar2 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(&this->Arguments),
          local_24 < sVar2; local_24 = local_24 + 1) {
        ppcVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                            (&this->Arguments,(ulong)local_24);
        if (*ppcVar3 != (value_type)0x0) {
          ppcVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                              (&this->Arguments,(ulong)local_24);
          bVar1 = std::operator==(arg,*ppcVar3);
          if (bVar1) {
            this->ArgumentDoing = 2;
            this->ArgumentIndex = local_24;
            return true;
          }
        }
      }
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestHandlerCommand::CheckArgumentKeyword(std::string const& arg)
{
  // Look for non-value arguments common to all commands.
  if (arg == "APPEND") {
    this->ArgumentDoing = ArgumentDoingNone;
    this->AppendXML = true;
    return true;
  }
  if (arg == "QUIET") {
    this->ArgumentDoing = ArgumentDoingNone;
    this->Quiet = true;
    return true;
  }

  // Check for a keyword in our argument/value table.
  for (unsigned int k = 0; k < this->Arguments.size(); ++k) {
    if (this->Arguments[k] && arg == this->Arguments[k]) {
      this->ArgumentDoing = ArgumentDoingKeyword;
      this->ArgumentIndex = k;
      return true;
    }
  }
  return false;
}